

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O2

void Abc_ObjPatchFanoutFanin(Abc_Obj_t *pObj,int iObjNew)

{
  void *pvVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = 0;
  do {
    if ((pObj->vFanouts).nSize <= lVar3) {
      return;
    }
    pvVar1 = pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar3]];
    uVar2 = (ulong)*(uint *)((long)pvVar1 + 0x1c);
    if ((int)*(uint *)((long)pvVar1 + 0x1c) < 1) {
      uVar2 = 0;
    }
    uVar4 = 0;
    while( true ) {
      if (uVar2 == uVar4) goto LAB_006ac386;
      if (*(int *)(*(long *)((long)pvVar1 + 0x20) + uVar4 * 4) == pObj->Id) break;
      uVar4 = uVar4 + 1;
    }
    Vec_IntWriteEntry((Vec_Int_t *)((long)pvVar1 + 0x18),(int)uVar4,iObjNew);
    lVar3 = lVar3 + 1;
  } while ((int)uVar4 < *(int *)((long)pvVar1 + 0x1c));
LAB_006ac386:
  __assert_fail("k < Vec_IntSize(&pFanout->vFanins)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanio.c"
                ,0xec,"void Abc_ObjPatchFanoutFanin(Abc_Obj_t *, int)");
}

Assistant:

void Abc_ObjPatchFanoutFanin( Abc_Obj_t * pObj, int iObjNew )
{
    Abc_Obj_t * pFanout;
    int i, k, Entry;
    // update fanouts of the node to point to this one
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        Vec_IntForEachEntry( &pFanout->vFanins, Entry, k )
            if ( Entry == (int)Abc_ObjId(pObj) )
            {
                Vec_IntWriteEntry( &pFanout->vFanins, k, iObjNew );
                break;
            }
        assert( k < Vec_IntSize(&pFanout->vFanins) );
    }
}